

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O3

CppTypeName * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::typeName
          (CppTypeName *__return_storage_ptr__,CapnpcCppMain *this,Type type,
          Maybe<capnp::InterfaceSchema::Method> *method)

{
  bool bVar1;
  Reader brand;
  undefined1 auVar2 [40];
  NullableValue<capnp::InterfaceSchema::Method> *pNVar3;
  undefined4 index;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Which WVar7;
  anon_union_2_2_d12d5221_for_Type_3 aVar8;
  uint uVar9;
  int iVar10;
  CppTypeName *extraout_RAX;
  undefined4 extraout_var;
  Schema SVar11;
  CppTypeName *pCVar12;
  uint *puVar13;
  size_t sVar14;
  char *pcVar15;
  char *pcVar16;
  InterfaceSchema IVar17;
  CppTypeName *ptrCopy;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  Type type_00;
  Reader RVar18;
  StringPtr innerName;
  Array<capnp::(anonymous_namespace)::CppTypeName> result;
  Fault f;
  Type local_198;
  NullableValue<capnp::InterfaceSchema::Method> local_188;
  undefined1 local_138 [48];
  undefined1 local_108 [12];
  undefined4 uStack_fc;
  WirePointer *local_f0;
  ushort local_e4;
  int local_e0;
  ArrayDisposer *local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  Schema local_a8;
  Maybe<capnp::InterfaceSchema::Method> local_a0;
  PointerReader local_58;
  
  local_198.field_4 = type.field_4;
  local_198._0_8_ = type._0_8_;
  uVar9 = 0xe;
  if (((undefined1  [16])type & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
    uVar9 = type._0_4_;
  }
  puVar13 = &switchD_0016476b::switchdataD_002200a8;
  switch(uVar9 & 0xffff) {
  case 0:
    pcVar15 = " ::capnp::Void";
    goto LAB_00164ada;
  case 1:
    pcVar15 = "bool";
    pcVar16 = (char *)0x5;
    break;
  case 2:
    pcVar15 = " ::int8_t";
    pcVar16 = (char *)0xa;
    break;
  case 3:
    pcVar15 = " ::int16_t";
    goto LAB_00164aeb;
  case 4:
    pcVar15 = " ::int32_t";
    goto LAB_00164aeb;
  case 5:
    pcVar15 = " ::int64_t";
    goto LAB_00164aeb;
  case 6:
    pcVar15 = " ::uint8_t";
LAB_00164aeb:
    pcVar16 = (char *)0xb;
    break;
  case 7:
    pcVar15 = " ::uint16_t";
    goto LAB_00164bde;
  case 8:
    pcVar15 = " ::uint32_t";
    goto LAB_00164bde;
  case 9:
    pcVar15 = " ::uint64_t";
LAB_00164bde:
    pcVar16 = (char *)0xc;
    break;
  case 10:
    pcVar15 = "float";
    pcVar16 = (char *)0x6;
    break;
  case 0xb:
    pcVar15 = "double";
    pcVar16 = (char *)0x7;
    break;
  case 0xc:
    pcVar15 = " ::capnp::Text";
    goto LAB_00164ada;
  case 0xd:
    pcVar15 = " ::capnp::Data";
LAB_00164ada:
    pcVar16 = (char *)0xf;
    break;
  case 0xe:
    name.content.size_ = (size_t)&switchD_0016476b::switchdataD_002200a8;
    name.content.ptr = (char *)0x6;
    CppTypeName::makeNamespace(__return_storage_ptr__,(CppTypeName *)0x2205cd,name);
    local_138._0_8_ =
         kj::_::HeapArrayDisposer::allocateImpl
                   (0x40,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_138._16_8_ = local_138._0_8_ + 0x80;
    local_138._24_8_ = &kj::_::HeapArrayDisposer::instance;
    local_138._8_8_ = local_138._0_8_;
    type_00 = (Type)Type::asList(&local_198);
    local_a0.ptr.isSet = (method->ptr).isSet;
    if (local_a0.ptr.isSet == true) {
      local_a0.ptr.field_1.value.parent.super_Schema.raw =
           (InterfaceSchema)(method->ptr).field_1.value.parent.super_Schema.raw;
      local_a0.ptr.field_1._8_8_ = *(undefined8 *)((long)&(method->ptr).field_1 + 8);
      local_a0.ptr.field_1.value.proto._reader.segment =
           (method->ptr).field_1.value.proto._reader.segment;
      local_a0.ptr.field_1.value.proto._reader.capTable =
           (method->ptr).field_1.value.proto._reader.capTable;
      local_a0.ptr.field_1.value.proto._reader.data = (method->ptr).field_1.value.proto._reader.data
      ;
      local_a0.ptr.field_1.value.proto._reader.pointers =
           (method->ptr).field_1.value.proto._reader.pointers;
      pNVar3 = &method->ptr;
      local_a0.ptr.field_1._48_4_ = *(StructDataBitCount *)((long)&pNVar3->field_1 + 0x30);
      local_a0.ptr.field_1._52_2_ = *(StructPointerCount *)((long)&pNVar3->field_1 + 0x34);
      local_a0.ptr.field_1._54_2_ = *(undefined2 *)((long)&pNVar3->field_1 + 0x36);
      local_a0.ptr.field_1._56_8_ =
           *(undefined8 *)&(method->ptr).field_1.value.proto._reader.nestingLimit;
    }
    typeName((CppTypeName *)&local_188,this,type_00,&local_a0);
    uVar5 = local_138._8_8_;
    ((StringTree *)local_138._8_8_)->size_ = local_188._0_8_;
    *(InterfaceSchema *)&(((StringTree *)local_138._8_8_)->text).content =
         local_188.field_1.value.parent.super_Schema.raw;
    (((StringTree *)local_138._8_8_)->text).content.size_ = local_188.field_1._8_8_;
    local_188.field_1.value.parent.super_Schema.raw = (InterfaceSchema)(Schema)0x0;
    local_188.field_1._8_8_ = (ArrayDisposer *)0x0;
    (((StringTree *)local_138._8_8_)->text).content.disposer =
         (ArrayDisposer *)local_188.field_1.value.proto._reader.segment;
    (((StringTree *)local_138._8_8_)->branches).ptr =
         (Branch *)local_188.field_1.value.proto._reader.capTable;
    (((StringTree *)local_138._8_8_)->branches).size_ =
         (size_t)local_188.field_1.value.proto._reader.data;
    (((StringTree *)local_138._8_8_)->branches).disposer =
         (ArrayDisposer *)local_188.field_1.value.proto._reader.pointers;
    local_188.field_1.value.proto._reader.capTable = (CapTableReader *)0x0;
    local_188.field_1.value.proto._reader.data = (void *)0x0;
    *(StructDataBitCount *)(local_138._8_8_ + 0x38) = local_188.field_1.value.proto._reader.dataSize
    ;
    local_138._8_8_ = local_138._8_8_ + 0x40;
    WVar7 = LIST;
    if (((undefined1  [16])type_00 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
      WVar7 = type_00.baseType;
    }
    if (WVar7 < (ANY_POINTER|BOOL)) {
      local_108._0_8_ = &DAT_002203d8 + *(int *)(&DAT_002203d8 + (ulong)WVar7 * 4);
      unique0x00012000 = *(CapTableReader **)(&DAT_00220428 + (ulong)WVar7 * 8);
      kj::StringTree::concat<kj::ArrayPtr<char_const>>
                ((StringTree *)&local_188,(StringTree *)local_108,
                 (ArrayPtr<const_char> *)local_108._0_8_);
      uVar6 = local_138._24_8_;
      uVar4 = local_138._0_8_;
      *(undefined8 *)(uVar5 + 0x40) = local_188._0_8_;
      *(InterfaceSchema *)&(((CppTypeName *)(uVar5 + 0x40))->name).text =
           local_188.field_1.value.parent.super_Schema.raw;
      (((CppTypeName *)(uVar5 + 0x40))->name).text.content.size_ = local_188.field_1._8_8_;
      (((CppTypeName *)(uVar5 + 0x40))->name).text.content.disposer =
           (ArrayDisposer *)local_188.field_1.value.proto._reader.segment;
      *(CapTableReader **)&(((CppTypeName *)(uVar5 + 0x40))->name).branches =
           local_188.field_1.value.proto._reader.capTable;
      (((CppTypeName *)(uVar5 + 0x40))->name).branches.size_ =
           (size_t)local_188.field_1.value.proto._reader.data;
      (((CppTypeName *)(uVar5 + 0x40))->name).branches.disposer =
           (ArrayDisposer *)local_188.field_1.value.proto._reader.pointers;
      pCVar12 = (CppTypeName *)(uVar5 + 0x40);
      pCVar12->isArgDependent = false;
      pCVar12->needsTypename = false;
      pCVar12->hasInterfaces_ = false;
      pCVar12->hasDisambiguatedTemplate_ = false;
      IVar17.super_Schema.raw = (Schema)(uVar5 + (0x80 - local_138._0_8_) >> 6);
      local_188._0_8_ = local_138._0_8_;
      local_188.field_1._8_8_ = local_138._24_8_;
      local_138._0_8_ = (SegmentReader *)0x0;
      local_138._8_8_ = (CapTableReader *)0x0;
      local_138._16_8_ = (byte *)0x0;
      innerName.content.size_ = 5;
      innerName.content.ptr = "List";
      local_188.field_1.value.parent.super_Schema.raw = (InterfaceSchema)IVar17.super_Schema.raw;
      CppTypeName::addMemberTemplate
                (__return_storage_ptr__,innerName,
                 (Array<capnp::(anonymous_namespace)::CppTypeName> *)&local_188);
      if ((CppTypeName *)uVar4 == (CppTypeName *)0x0) {
        return extraout_RAX;
      }
      local_188._0_8_ = (CppTypeName *)0x0;
      local_188.field_1.value.parent.super_Schema.raw = (InterfaceSchema)(Schema)0x0;
      iVar10 = (**(_func_int **)*(WirePointer *)uVar6)
                         (uVar6,uVar4,0x40,IVar17.super_Schema.raw,IVar17.super_Schema.raw,
                          kj::ArrayDisposer::
                          Dispose_<capnp::(anonymous_namespace)::CppTypeName,_false>::destruct);
      return (CppTypeName *)CONCAT44(extraout_var,iVar10);
    }
    kj::_::unreachable();
  case 0xf:
    SVar11.raw = (RawBrandedSchema *)Type::asEnum(&local_198);
    goto LAB_001649f9;
  case 0x10:
    SVar11.raw = (RawBrandedSchema *)Type::asStruct(&local_198);
LAB_001649f9:
    bVar1 = (method->ptr).isSet;
    if (bVar1 != false) {
      local_188.field_1.value.parent.super_Schema.raw =
           (InterfaceSchema)(method->ptr).field_1.value.parent.super_Schema.raw;
      local_188.field_1._8_8_ = *(size_t *)((long)&(method->ptr).field_1 + 8);
      local_188.field_1.value.proto._reader.segment =
           (method->ptr).field_1.value.proto._reader.segment;
      local_188.field_1.value.proto._reader.capTable =
           (method->ptr).field_1.value.proto._reader.capTable;
      local_188.field_1.value.proto._reader.data = (method->ptr).field_1.value.proto._reader.data;
      local_188.field_1.value.proto._reader.pointers =
           (method->ptr).field_1.value.proto._reader.pointers;
      local_188.field_1._48_8_ = *(undefined8 *)&(method->ptr).field_1.value.proto._reader.dataSize;
      local_188.field_1._56_8_ =
           *(undefined8 *)&(method->ptr).field_1.value.proto._reader.nestingLimit;
    }
    local_188.isSet = bVar1;
    pCVar12 = cppFullName(__return_storage_ptr__,this,SVar11,SVar11,
                          (Maybe<capnp::InterfaceSchema::Method> *)&local_188);
    return pCVar12;
  case 0x11:
    SVar11.raw = (RawBrandedSchema *)Type::asInterface(&local_198);
    bVar1 = (method->ptr).isSet;
    if (bVar1 != false) {
      local_188.field_1.value.parent.super_Schema.raw =
           (InterfaceSchema)(method->ptr).field_1.value.parent.super_Schema.raw;
      local_188.field_1._8_8_ = *(size_t *)((long)&(method->ptr).field_1 + 8);
      local_188.field_1.value.proto._reader.segment =
           (method->ptr).field_1.value.proto._reader.segment;
      local_188.field_1.value.proto._reader.capTable =
           (method->ptr).field_1.value.proto._reader.capTable;
      local_188.field_1.value.proto._reader.data = (method->ptr).field_1.value.proto._reader.data;
      local_188.field_1.value.proto._reader.pointers =
           (method->ptr).field_1.value.proto._reader.pointers;
      local_188.field_1._48_8_ = *(undefined8 *)&(method->ptr).field_1.value.proto._reader.dataSize;
      local_188.field_1._56_8_ =
           *(undefined8 *)&(method->ptr).field_1.value.proto._reader.nestingLimit;
    }
    local_188.isSet = bVar1;
    pCVar12 = cppFullName(__return_storage_ptr__,this,SVar11,SVar11,
                          (Maybe<capnp::InterfaceSchema::Method> *)&local_188);
    __return_storage_ptr__->hasInterfaces_ = true;
    return pCVar12;
  case 0x12:
    Type::getBrandParameter((Maybe<capnp::Type::BrandParameter> *)&local_188,&local_198);
    if (local_188.isSet == true) {
      index = local_188.field_1._8_4_;
      local_b8 = 0;
      local_d8 = (ArrayDisposer *)0x0;
      uStack_d0 = 0;
      local_c8 = 0;
      uStack_c0 = 0;
      uStack_b0 = 0x7fffffff;
      auVar2 = ZEXT1640(ZEXT816(0));
      brand._reader._40_8_ = 0x7fffffff;
      brand._reader.segment = (SegmentReader *)auVar2._0_8_;
      brand._reader.capTable = (CapTableReader *)auVar2._8_8_;
      brand._reader.data = (void *)auVar2._16_8_;
      brand._reader.pointers = (WirePointer *)auVar2._24_8_;
      brand._reader.dataSize = auVar2._32_4_;
      brand._reader.pointerCount = auVar2._36_2_;
      brand._reader._38_2_ = auVar2._38_2_;
      local_a8 = SchemaLoader::get(&this->schemaLoader,
                                   (uint64_t)local_188.field_1.value.parent.super_Schema.raw,brand,
                                   (Schema)0x27d320);
      Schema::getProto((Reader *)local_108,&local_a8);
      local_188.field_1._8_8_ = local_f0 + 5;
      if (local_e4 < 6) {
        local_108[0] = false;
        local_108._1_3_ = 0;
        local_108._4_4_ = 0;
        local_108._8_4_ = 0;
        uStack_fc = 0;
        local_188.field_1._8_8_ = (WirePointer *)0x0;
        local_e0 = 0x7fffffff;
      }
      else {
      }
      local_188.field_1._16_4_ = local_e0;
      sVar14 = 0;
      local_188._0_4_ = local_108._0_4_;
      local_188._4_4_ = local_108._4_4_;
      local_188.field_1._0_4_ = local_108._8_4_;
      local_188.field_1._4_4_ = uStack_fc;
      _::PointerReader::getList
                ((ListReader *)local_138,(PointerReader *)&local_188,INLINE_COMPOSITE,(word *)0x0);
      _::ListReader::getStructElement((StructReader *)&local_188,(ListReader *)local_138,index);
      local_58.pointer = (WirePointer *)(SegmentReader *)0x0;
      local_58.nestingLimit = 0x7fffffff;
      if (local_188.field_1._28_2_ != 0) {
        local_58.pointer = (WirePointer *)local_188.field_1.value.proto._reader.segment;
        local_58.nestingLimit = local_188.field_1._32_4_;
      }
      local_58.segment._0_1_ = false;
      local_58.segment._1_3_ = 0;
      local_58.segment._4_4_ = 0;
      local_58.capTable._0_4_ = 0;
      local_58.capTable._4_4_ = 0;
      if (local_188.field_1._28_2_ != 0) {
        local_58.segment._0_4_ = local_188._0_4_;
        local_58.segment._4_4_ = local_188._4_4_;
        local_58.capTable._0_4_ = local_188.field_1._0_4_;
        local_58.capTable._4_4_ = local_188.field_1._4_4_;
      }
      RVar18 = _::PointerReader::getBlob<capnp::Text>(&local_58,(void *)0x0,0);
      name_02.content.ptr = RVar18.super_StringPtr.content.size_;
      name_02.content.size_ = sVar14;
      pCVar12 = CppTypeName::makeTemplateParam
                          (__return_storage_ptr__,RVar18.super_StringPtr.content.ptr,name_02);
    }
    else {
      Type::getImplicitParameter((Type *)&local_188);
      if (local_188.isSet == true) {
        if ((method->ptr).isSet == true) {
          local_138._0_8_ = (method->ptr).field_1.value.proto._reader.segment;
          local_138._8_8_ = (method->ptr).field_1.value.proto._reader.capTable;
          local_138._16_8_ = (method->ptr).field_1.value.proto._reader.data;
          local_138._24_8_ = (method->ptr).field_1.value.proto._reader.pointers;
          pNVar3 = &method->ptr;
          local_138._32_4_ = *(StructDataBitCount *)((long)&pNVar3->field_1 + 0x30);
          local_138._36_2_ = *(StructPointerCount *)((long)&pNVar3->field_1 + 0x34);
          local_138[0x26] = *(undefined1 *)((long)&pNVar3->field_1 + 0x36);
          local_138[0x27] = *(undefined1 *)((long)&pNVar3->field_1 + 0x37);
          local_138._40_4_ = *(int *)((long)&(method->ptr).field_1 + 0x38);
          local_138._44_4_ = *(undefined4 *)((long)&(method->ptr).field_1 + 0x3c);
          capnp::schema::Method::Reader::getImplicitParameters
                    ((Reader *)&local_188,(Reader *)local_138);
          if ((uint)local_188._4_4_ < (uint)local_188.field_1._16_4_) {
            _::ListReader::getStructElement
                      ((StructReader *)local_138,(ListReader *)&local_188,local_188._4_4_);
            RVar18 = capnp::schema::Node::Parameter::Reader::getName((Reader *)local_138);
            name_01.content.ptr = RVar18.super_StringPtr.content.size_;
            name_01.content.size_ = (size_t)puVar13;
            pCVar12 = CppTypeName::makeTemplateParam
                                (__return_storage_ptr__,RVar18.super_StringPtr.content.ptr,name_01);
            return pCVar12;
          }
          local_108._0_8_ = (Exception *)0x0;
          local_138._0_8_ = (SegmentReader *)0x0;
          local_138._8_8_ = (CapTableReader *)0x0;
          kj::_::Debug::Fault::init
                    ((Fault *)local_108,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnpc-c++.c++"
                    );
          kj::_::Debug::Fault::fatal((Fault *)local_108);
        }
        pcVar16 = " ::capnp::AnyPointer";
        pcVar15 = (char *)0x15;
      }
      else {
        aVar8.paramIndex = 0;
        if (local_198.field_4.schema == (RawBrandedSchema *)0x0) {
          aVar8.paramIndex = local_198.field_3.paramIndex;
        }
        if (local_198.isImplicitParam != false) {
          aVar8.paramIndex = 0;
        }
        pcVar15 = (char *)0x15;
        puVar13 = &switchD_00164d51::switchdataD_002200f4;
        switch(aVar8.paramIndex) {
        case 0:
          pcVar16 = " ::capnp::AnyPointer";
          break;
        case 1:
          pcVar15 = (char *)0x14;
          pcVar16 = " ::capnp::AnyStruct";
          break;
        case 2:
          pcVar15 = (char *)0x12;
          pcVar16 = " ::capnp::AnyList";
          break;
        case 3:
          this->hasInterfaces = true;
          pcVar16 = " ::capnp::Capability";
          break;
        default:
          goto switchD_0016476b_default;
        }
      }
      name_03.content.size_ = (size_t)puVar13;
      name_03.content.ptr = pcVar15;
      pCVar12 = CppTypeName::makePrimitive(__return_storage_ptr__,(CppTypeName *)pcVar16,name_03);
    }
    return pCVar12;
  default:
switchD_0016476b_default:
    kj::_::unreachable();
  }
  name_00.content.size_ = (size_t)&switchD_0016476b::switchdataD_002200a8;
  name_00.content.ptr = pcVar16;
  pCVar12 = CppTypeName::makePrimitive(__return_storage_ptr__,(CppTypeName *)pcVar15,name_00);
  return pCVar12;
}

Assistant:

CppTypeName typeName(Type type, kj::Maybe<InterfaceSchema::Method> method) {
    switch (type.which()) {
      case schema::Type::VOID: return CppTypeName::makePrimitive(" ::capnp::Void");

      case schema::Type::BOOL: return CppTypeName::makePrimitive("bool");
      case schema::Type::INT8: return CppTypeName::makePrimitive(" ::int8_t");
      case schema::Type::INT16: return CppTypeName::makePrimitive(" ::int16_t");
      case schema::Type::INT32: return CppTypeName::makePrimitive(" ::int32_t");
      case schema::Type::INT64: return CppTypeName::makePrimitive(" ::int64_t");
      case schema::Type::UINT8: return CppTypeName::makePrimitive(" ::uint8_t");
      case schema::Type::UINT16: return CppTypeName::makePrimitive(" ::uint16_t");
      case schema::Type::UINT32: return CppTypeName::makePrimitive(" ::uint32_t");
      case schema::Type::UINT64: return CppTypeName::makePrimitive(" ::uint64_t");
      case schema::Type::FLOAT32: return CppTypeName::makePrimitive("float");
      case schema::Type::FLOAT64: return CppTypeName::makePrimitive("double");

      case schema::Type::TEXT: return CppTypeName::makePrimitive(" ::capnp::Text");
      case schema::Type::DATA: return CppTypeName::makePrimitive(" ::capnp::Data");

      case schema::Type::ENUM:
        return cppFullName(type.asEnum(), method);
      case schema::Type::STRUCT:
        return cppFullName(type.asStruct(), method);
      case schema::Type::INTERFACE: {
        auto result = cppFullName(type.asInterface(), method);
        result.setHasInterfaces();
        return result;
      }

      case schema::Type::LIST: {
        CppTypeName result = CppTypeName::makeNamespace("capnp");
        auto params = kj::heapArrayBuilder<CppTypeName>(2);
        auto list = type.asList();
        params.add(typeName(list.getElementType(), method));
        params.add(whichKind(list.whichElementType()));
        result.addMemberTemplate("List", params.finish());
        return result;
      }

      case schema::Type::ANY_POINTER:
        KJ_IF_MAYBE(param, type.getBrandParameter()) {
          return CppTypeName::makeTemplateParam(schemaLoader.get(param->scopeId).getProto()
              .getParameters()[param->index].getName());
        } else KJ_IF_MAYBE(param, type.getImplicitParameter()) {
          KJ_IF_MAYBE(m, method) {
            auto params = m->getProto().getImplicitParameters();
            KJ_REQUIRE(param->index < params.size());
            return CppTypeName::makeTemplateParam(params[param->index].getName());
          } else {
            return CppTypeName::makePrimitive(" ::capnp::AnyPointer");
          }
        } else {
          switch (type.whichAnyPointerKind()) {
            case schema::Type::AnyPointer::Unconstrained::ANY_KIND:
              return CppTypeName::makePrimitive(" ::capnp::AnyPointer");
            case schema::Type::AnyPointer::Unconstrained::STRUCT:
              return CppTypeName::makePrimitive(" ::capnp::AnyStruct");
            case schema::Type::AnyPointer::Unconstrained::LIST:
              return CppTypeName::makePrimitive(" ::capnp::AnyList");
            case schema::Type::AnyPointer::Unconstrained::CAPABILITY:
              hasInterfaces = true;  // Probably need to #include <capnp/capability.h>.
              return CppTypeName::makePrimitive(" ::capnp::Capability");
          }